

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool mkvparser::SeekHead::ParseEntry
               (IMkvReader *pReader,longlong start,longlong size_,Entry *pEntry)

{
  long in_RAX;
  longlong lVar1;
  longlong lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long len;
  long local_38;
  
  if (size_ < 1) {
    return false;
  }
  local_38 = in_RAX;
  lVar1 = ReadID(pReader,start,&local_38);
  if ((lVar1 == 0x53ab) && (local_38 <= size_)) {
    lVar5 = local_38 + start;
    lVar1 = ReadUInt(pReader,lVar5,&local_38);
    if (0 < lVar1) {
      lVar3 = size_ + start;
      lVar5 = lVar5 + local_38;
      if ((lVar5 <= lVar3) && (lVar4 = lVar1 + lVar5, lVar4 <= lVar3)) {
        lVar2 = ReadID(pReader,lVar5,&local_38);
        pEntry->id = lVar2;
        if (lVar2 < 1) {
          return false;
        }
        if (local_38 != lVar1) {
          return false;
        }
        lVar1 = ReadID(pReader,lVar4,&local_38);
        if ((((lVar1 == 0x53ac) && (lVar4 = lVar4 + local_38, lVar4 <= lVar3)) &&
            (lVar1 = ReadUInt(pReader,lVar4,&local_38), 0 < lVar1)) &&
           ((lVar4 = lVar4 + local_38, lVar4 <= lVar3 && (lVar4 + lVar1 <= lVar3)))) {
          lVar2 = UnserializeUInt(pReader,lVar4,lVar1);
          pEntry->pos = lVar2;
          return lVar4 + lVar1 == lVar3 && -1 < lVar2;
        }
      }
    }
  }
  return false;
}

Assistant:

bool SeekHead::ParseEntry(IMkvReader* pReader, long long start, long long size_,
                          Entry* pEntry) {
  if (size_ <= 0)
    return false;

  long long pos = start;
  const long long stop = start + size_;

  long len;

  // parse the container for the level-1 element ID

  const long long seekIdId = ReadID(pReader, pos, len);
  if (seekIdId < 0)
    return false;

  if (seekIdId != libwebm::kMkvSeekID)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume SeekID id

  const long long seekIdSize = ReadUInt(pReader, pos, len);

  if (seekIdSize <= 0)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume size of field

  if ((pos + seekIdSize) > stop)
    return false;

  pEntry->id = ReadID(pReader, pos, len);  // payload

  if (pEntry->id <= 0)
    return false;

  if (len != seekIdSize)
    return false;

  pos += seekIdSize;  // consume SeekID payload

  const long long seekPosId = ReadID(pReader, pos, len);

  if (seekPosId != libwebm::kMkvSeekPosition)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume id

  const long long seekPosSize = ReadUInt(pReader, pos, len);

  if (seekPosSize <= 0)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume size

  if ((pos + seekPosSize) > stop)
    return false;

  pEntry->pos = UnserializeUInt(pReader, pos, seekPosSize);

  if (pEntry->pos < 0)
    return false;

  pos += seekPosSize;  // consume payload

  if (pos != stop)
    return false;

  return true;
}